

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsDrawTest.cpp
# Opt level: O0

bool deqp::gls::anon_unknown_1::outputTypeIsUintType(OutputType type)

{
  undefined1 local_9;
  OutputType type_local;
  
  if ((((type == OUTPUTTYPE_UINT) || (type == OUTPUTTYPE_UVEC2)) || (type == OUTPUTTYPE_UVEC3)) ||
     (type == OUTPUTTYPE_UVEC4)) {
    local_9 = true;
  }
  else {
    local_9 = false;
  }
  return local_9;
}

Assistant:

static bool outputTypeIsUintType (DrawTestSpec::OutputType type)
{
	if (type == DrawTestSpec::OUTPUTTYPE_UINT
		|| type == DrawTestSpec::OUTPUTTYPE_UVEC2
		|| type == DrawTestSpec::OUTPUTTYPE_UVEC3
		|| type == DrawTestSpec::OUTPUTTYPE_UVEC4)
		return true;

	return false;
}